

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O3

RK_S32 decode_nal_sei_frame_packing_arrangement(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  undefined8 in_RAX;
  RK_U32 _out;
  RK_U32 local_14;
  
  local_14 = (RK_U32)((ulong)in_RAX >> 0x20);
  MVar1 = mpp_read_ue(gb,&local_14);
  gb->ret = MVar1;
  if (MVar1 == MPP_OK) {
    MVar1 = mpp_read_bits(gb,1,(RK_S32 *)&local_14);
    gb->ret = MVar1;
    if (MVar1 == MPP_OK) {
      s->sei_frame_packing_present = (uint)(local_14 == 0);
      if (local_14 == 0) {
        MVar1 = mpp_read_bits(gb,7,(RK_S32 *)&local_14);
        gb->ret = MVar1;
        if (MVar1 != MPP_OK) {
          return -0x3ec;
        }
        s->frame_packing_arrangement_type = local_14;
        MVar1 = mpp_read_bits(gb,1,(RK_S32 *)&local_14);
        gb->ret = MVar1;
        if (MVar1 != MPP_OK) {
          return -0x3ec;
        }
        s->quincunx_subsampling = local_14;
        MVar1 = mpp_read_bits(gb,6,(RK_S32 *)&local_14);
        gb->ret = MVar1;
        if (MVar1 != MPP_OK) {
          return -0x3ec;
        }
        s->content_interpretation_type = local_14;
        MVar1 = mpp_skip_longbits(gb,6);
        gb->ret = MVar1;
        if (MVar1 != MPP_OK) {
          return -0x3ec;
        }
        if ((s->quincunx_subsampling == 0) && (s->frame_packing_arrangement_type != 5)) {
          MVar1 = mpp_skip_longbits(gb,0x10);
          gb->ret = MVar1;
          if (MVar1 != MPP_OK) {
            return -0x3ec;
          }
        }
        MVar1 = mpp_skip_longbits(gb,8);
        gb->ret = MVar1;
        if (MVar1 != MPP_OK) {
          return -0x3ec;
        }
        MVar1 = mpp_skip_longbits(gb,1);
        gb->ret = MVar1;
        if (MVar1 != MPP_OK) {
          return -0x3ec;
        }
      }
      MVar1 = mpp_skip_longbits(gb,1);
      gb->ret = MVar1;
      if (MVar1 == MPP_OK) {
        return 0;
      }
    }
  }
  return -0x3ec;
}

Assistant:

static RK_S32 decode_nal_sei_frame_packing_arrangement(HEVCContext *s, BitReadCtx_t *gb)
{
    RK_S32 value = 0;

    READ_UE(gb, &value);                  // frame_packing_arrangement_id
    READ_ONEBIT(gb, &value);
    s->sei_frame_packing_present = !value;

    if (s->sei_frame_packing_present) {
        READ_BITS(gb, 7, &s->frame_packing_arrangement_type);
        READ_ONEBIT(gb, &s->quincunx_subsampling);
        READ_BITS(gb, 6, &s->content_interpretation_type);

        // the following skips spatial_flipping_flag frame0_flipped_flag
        // field_views_flag current_frame_is_frame0_flag
        // frame0_self_contained_flag frame1_self_contained_flag
        SKIP_BITS(gb, 6);

        if (!s->quincunx_subsampling && s->frame_packing_arrangement_type != 5)
            SKIP_BITS(gb, 16);  // frame[01]_grid_position_[xy]
        SKIP_BITS(gb, 8);       // frame_packing_arrangement_reserved_byte
        SKIP_BITS(gb, 1);        // frame_packing_arrangement_persistance_flag
    }
    SKIP_BITS(gb, 1);            // upsampled_aspect_ratio_flag
    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}